

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WildLCS.cpp
# Opt level: O0

vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
* __thiscall
WildLCS::gen_rules_abi_cxx11_
          (vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *__return_storage_ptr__,WildLCS *this)

{
  pointer *this_00;
  pointer *this_01;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  char *pcVar10;
  ulong uVar11;
  reference pvVar12;
  ulong uVar13;
  reference ppVar14;
  reference pvVar15;
  key_type *pkVar16;
  size_type sVar17;
  mapped_type *pmVar18;
  reference pvVar19;
  size_type sVar20;
  long lVar21;
  reference __rhs;
  pair<std::__detail::_Node_iterator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>,_bool>
  pVar22;
  int local_314;
  allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_261;
  _Node_iterator_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
  local_260;
  _Node_iterator_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
  local_258;
  _Node_iterator_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
  local_250;
  undefined1 local_248;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  undefined4 local_210;
  int local_20c;
  undefined1 local_208 [4];
  int j_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs;
  int en_1;
  int st_1;
  int node_1;
  pair<int,_std::pair<int,_int>_> cp_1;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  *__range2;
  pair<int,_int> local_198;
  pair<int,_int> local_190;
  pair<int,_int> local_188;
  int local_180;
  int local_17c;
  int new_en;
  int new_st;
  int new_node;
  int en;
  int st;
  int node;
  pair<int,_std::pair<int,_int>_> cp;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  *__range3;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  cur_H;
  int j_2;
  int local_110 [2];
  pair<int,_int> local_108;
  int local_100 [2];
  pair<int,_int> local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int j_1;
  int k;
  int j;
  vector<int,_std::allocator<int>_> token_id;
  string local_c0 [8];
  string cur_string;
  undefined1 local_98 [4];
  int i;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  H;
  allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
  local_69;
  undefined1 local_68 [8];
  vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
  used;
  unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  rules;
  WildLCS *this_local;
  
  std::
  unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::unordered_set((unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&used.
                      super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar7 = std::
          vector<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
          ::size(&this->trie);
  std::
  allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
  ::allocator(&local_69);
  std::
  vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector((vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
            *)local_68,sVar7,&local_69);
  std::
  allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
  ::~allocator(&local_69);
  std::
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
            *)local_98);
  cur_string.field_2._12_4_ = 0;
  do {
    if ((this->super_RuleGenerator).n <= (int)cur_string.field_2._12_4_) {
      this_00 = &used.
                 super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_258._M_cur =
           (__node_type *)
           std::
           unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::begin((unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)this_00);
      local_260._M_cur =
           (__node_type *)
           std::
           unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)this_00);
      std::
      allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::allocator(&local_261);
      std::
      vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
      ::
      vector<std::__detail::_Node_iterator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,true,true>,void>
                ((vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  *)__return_storage_ptr__,
                 (_Node_iterator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
                  )local_258._M_cur,
                 (_Node_iterator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
                  )local_260._M_cur,&local_261);
      std::
      allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~allocator(&local_261);
      local_210 = 1;
      std::
      vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ::~vector((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                 *)local_98);
      std::
      vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~vector((vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 *)local_68);
      std::
      unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~unordered_set((unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&used.
                           super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"",
               (allocator *)
               ((long)&token_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&token_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&k);
    j_1 = 0;
    while( true ) {
      iVar1 = j_1;
      pvVar8 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&(this->super_RuleGenerator).tokens,(long)(int)cur_string.field_2._12_4_
                           );
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar8);
      if ((int)sVar7 <= iVar1) break;
      local_e8 = 0;
      while( true ) {
        iVar1 = local_e8;
        pvVar8 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&(this->super_RuleGenerator).tokens,
                              (long)(int)cur_string.field_2._12_4_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvVar8,(long)j_1);
        iVar6 = std::__cxx11::string::size();
        if (iVar6 <= iVar1) break;
        pvVar8 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&(this->super_RuleGenerator).tokens,
                              (long)(int)cur_string.field_2._12_4_);
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar8,(long)j_1);
        pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)pvVar9);
        std::__cxx11::string::operator+=(local_c0,*pcVar10);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&k,&j_1);
        local_e8 = local_e8 + 1;
      }
      j_1 = j_1 + 1;
    }
    std::
    vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
    ::clear((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
             *)local_98);
    for (local_ec = 0; uVar11 = (ulong)local_ec,
        sVar7 = std::
                vector<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                ::size(&this->trie), uVar11 < sVar7; local_ec = local_ec + 1) {
      pvVar12 = std::
                vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ::operator[]((vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              *)local_68,(long)local_ec);
      std::
      unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::clear(pvVar12);
    }
    local_f0 = 0;
    local_100[1] = 0;
    local_100[0] = 0;
    local_f8 = std::make_pair<int,int>(local_100 + 1,local_100);
    std::vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
    ::emplace_back<int,std::pair<int,int>>
              ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                *)local_98,&local_f0,&local_f8);
    pvVar12 = std::
              vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
              ::operator[]((vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            *)local_68,0);
    local_110[1] = 0;
    local_110[0] = 0;
    local_108 = std::make_pair<int,int>(local_110 + 1,local_110);
    std::
    unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::insert(pvVar12,&local_108);
    for (cur_H.
         super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uVar11 = (ulong)cur_H.
                        super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        uVar13 = std::__cxx11::string::size(), uVar11 < uVar13;
        cur_H.
        super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             cur_H.
             super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::
      vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ::vector((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                *)&__range3,
               (vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                *)local_98);
      __end3 = std::
               vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
               ::begin((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                        *)&__range3);
      register0x00000000 =
           std::
           vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
           ::end((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                  *)&__range3);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::pair<int,_std::pair<int,_int>_>_*,_std::vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>_>
                                         *)&cp.second.second), bVar4) {
        ppVar14 = __gnu_cxx::
                  __normal_iterator<std::pair<int,_std::pair<int,_int>_>_*,_std::vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>_>
                  ::operator*(&__end3);
        new_st = (ppVar14->second).second;
        st = ppVar14->first;
        unique0x00012004 = (ppVar14->second).first;
        en = st;
        new_node = unique0x00012004;
        cp.first = new_st;
        pvVar15 = std::
                  vector<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                  ::operator[](&this->trie,(long)(int)st);
        pkVar16 = (key_type *)std::__cxx11::string::operator[]((ulong)local_c0);
        sVar17 = std::
                 unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::count(pvVar15,pkVar16);
        if (sVar17 != 0) {
          pvVar15 = std::
                    vector<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                    ::operator[](&this->trie,(long)en);
          pkVar16 = (key_type *)std::__cxx11::string::operator[]((ulong)local_c0);
          pmVar18 = std::
                    unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                    ::operator[](pvVar15,pkVar16);
          new_en = *pmVar18;
          if (new_node == 0) {
            pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)&k,
                                 (long)cur_H.
                                       super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            local_314 = *pvVar19 + 1;
          }
          else {
            local_314 = new_node;
          }
          local_17c = local_314;
          pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&k,
                               (long)cur_H.
                                     super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          local_180 = *pvVar19 + 1;
          pvVar12 = std::
                    vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    ::operator[]((vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                  *)local_68,(long)new_en);
          local_188 = std::make_pair<int&,int&>(&local_17c,&local_180);
          sVar20 = std::
                   unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   ::count(pvVar12,&local_188);
          if (sVar20 == 0) {
            local_190 = std::make_pair<int&,int&>(&local_17c,&local_180);
            std::
            vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
            ::emplace_back<int&,std::pair<int,int>>
                      ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                        *)local_98,&new_en,&local_190);
            pvVar12 = std::
                      vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ::operator[]((vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                    *)local_68,(long)new_en);
            local_198 = std::make_pair<int&,int&>(&local_17c,&local_180);
            std::
            unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::insert(pvVar12,&local_198);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::pair<int,_std::pair<int,_int>_>_*,_std::vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ::~vector((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                 *)&__range3);
    }
    __end2 = std::
             vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
             ::begin((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                      *)local_98);
    cp_1.second = (pair<int,_int>)
                  std::
                  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                  ::end((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                         *)local_98);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<int,_std::pair<int,_int>_>_*,_std::vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>_>
                                       *)&cp_1.second), bVar4) {
      ppVar14 = __gnu_cxx::
                __normal_iterator<std::pair<int,_std::pair<int,_int>_>_*,_std::vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>_>
                ::operator*(&__end2);
      uVar2 = ppVar14->first;
      uVar3 = (ppVar14->second).first;
      iVar1 = (ppVar14->second).second;
      cp_1.first = iVar1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->contain_word,(long)(int)uVar2);
      lVar21 = std::__cxx11::string::size();
      if (lVar21 != 0) {
        this_01 = &rhs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_01);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_208);
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->contain_word,(long)(int)uVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_01,pvVar9);
        for (local_20c = uVar3 + -1; local_20c < iVar1; local_20c = local_20c + 1) {
          pvVar8 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&(this->super_RuleGenerator).tokens,
                                (long)(int)cur_string.field_2._12_4_);
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar8,(long)local_20c);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_208,pvVar9);
        }
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_208);
        if (sVar7 == 1) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&rhs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          __rhs = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_208,0);
          _Var5 = std::operator==(pvVar9,__rhs);
          if (!_Var5) goto LAB_001465ea;
          local_210 = 0x14;
        }
        else {
LAB_001465ea:
          std::
          make_pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    (&local_240,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&rhs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_208);
          pVar22 = std::
                   unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::insert((unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             *)&used.
                                super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_240);
          local_250._M_cur =
               (__node_type *)
               pVar22.first.
               super__Node_iterator_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
               ._M_cur;
          local_248 = pVar22.second;
          std::
          pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~pair(&local_240);
          local_210 = 0;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_208);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&rhs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<int,_std::pair<int,_int>_>_*,_std::vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&k);
    std::__cxx11::string::~string(local_c0);
    cur_string.field_2._12_4_ = cur_string.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

vector<t_rule> WildLCS::gen_rules()
{
	unordered_set<t_rule, rule_hash> rules;
	vector<unordered_set<pair<int, int>, pairii_hash>> used(trie.size());
	vector<pair<int, pair<int, int>>> H;

	for (int i = 0; i < n; i ++)
	{
		string cur_string = "";
		vector<int> token_id;

		for (int j = 0; j < (int) tokens[i].size(); j ++)
			for (int k = 0; k < (int) tokens[i][j].size(); k ++)
			{
				cur_string += tokens[i][j][k];
				token_id.push_back(j);
			}

		//traversal
		H.clear();
		for (auto j = 0; j < trie.size(); j ++)
			used[j].clear();
		H.emplace_back(0, make_pair(0, 0));
		used[0].insert(make_pair(0, 0));
		for (auto j = 0; j < cur_string.size(); j ++)
		{
			vector<pair<int, pair<int, int>>> cur_H = H;
			for (auto cp : cur_H)
			{
				int node = cp.first;
				int st = cp.second.first;
				int en = cp.second.second;

				//include current character
				if (trie[node].count(cur_string[j]))
				{
					int new_node = trie[node][cur_string[j]];
					int new_st = (st == 0 ? token_id[j] + 1 : st);
					int new_en = token_id[j] + 1;
					if (! used[new_node].count(make_pair(new_st, new_en)))
					{
						H.emplace_back(new_node, make_pair(new_st, new_en));
						used[new_node].insert(make_pair(new_st, new_en));
					}
				}
			}
		}

		//output rules
		for (auto cp : H)
		{
			int node = cp.first;
			int st = cp.second.first;
			int en = cp.second.second;
			if (! contain_word[node].size())
				continue;
			vector<string> lhs, rhs;
			lhs.push_back(contain_word[node]);
			for (int j = st - 1; j < en; j ++)
				rhs.push_back(tokens[i][j]);

			//get rid of identity rules
			if (rhs.size() == 1 && lhs[0] == rhs[0])
				continue;

			rules.insert(make_pair(lhs, rhs));
		}
	}

	return vector<t_rule>(rules.begin(), rules.end());
}